

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O1

void __thiscall MIDISong2::ProcessInitialMetaEvents(MIDISong2 *this)

{
  TrackInfo *pTVar1;
  byte *pbVar2;
  BYTE BVar3;
  ulong uVar4;
  BYTE *pBVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (0 < this->NumTracks) {
    lVar9 = 0;
    do {
      pTVar1 = this->Tracks + lVar9;
      if (this->Tracks[lVar9].Finished == false) {
        do {
          uVar7 = pTVar1->TrackP;
          uVar4 = pTVar1->MaxTrackP;
          if (((uVar4 - 4 <= uVar7) || (pBVar5 = pTVar1->TrackBegin, pBVar5[uVar7] != '\0')) ||
             (pBVar5[uVar7 + 1] != 0xff)) break;
          BVar3 = pBVar5[uVar7 + 2];
          pTVar1->TrackP = uVar7 + 3;
          uVar8 = 0;
          uVar7 = uVar7 + 3;
          do {
            if (uVar4 <= uVar7) break;
            pTVar1->TrackP = uVar7 + 1;
            pbVar2 = pBVar5 + uVar7;
            uVar8 = uVar8 << 7 | *pbVar2 & 0x7f;
            uVar7 = uVar7 + 1;
          } while ((char)*pbVar2 < '\0');
          sVar6 = pTVar1->TrackP;
          if (sVar6 + uVar8 <= uVar4) {
            if (BVar3 == 'Q') {
              MIDIStreamer::SetTempo
                        (&this->super_MIDIStreamer,
                         (uint)pBVar5[sVar6 + 2] |
                         (uint)pBVar5[sVar6 + 1] << 8 | (uint)pBVar5[sVar6] << 0x10);
            }
            else if (BVar3 == '/') {
              pTVar1->Finished = true;
            }
          }
          pTVar1->TrackP = pTVar1->TrackP + (ulong)uVar8;
        } while (pTVar1->Finished != true);
      }
      if (pTVar1->MaxTrackP - 4 <= pTVar1->TrackP) {
        pTVar1->Finished = true;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->NumTracks);
  }
  return;
}

Assistant:

void MIDISong2::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = track->ReadVarLen ();
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}